

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildKey.h
# Opt level: O0

StringRef __thiscall llbuild::buildsystem::BuildKey::getCommandName(BuildKey *this)

{
  bool bVar1;
  char *pcVar2;
  size_t sVar3;
  BuildKey *this_local;
  long local_28;
  
  bVar1 = isCommand(this);
  if (!bVar1) {
    __assert_fail("isCommand()",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llbuild/BuildSystem/BuildKey.h"
                  ,0xe1,"StringRef llbuild::buildsystem::BuildKey::getCommandName() const");
  }
  pcVar2 = core::KeyType::data(&this->key);
  sVar3 = core::KeyType::size(&this->key);
  this_local = (BuildKey *)(pcVar2 + 1);
  local_28 = sVar3 - 1;
  return _this_local;
}

Assistant:

StringRef getCommandName() const {
    assert(isCommand());
    return StringRef(key.data()+1, key.size()-1);
  }